

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_spin_flip.hpp
# Opt level: O2

void openjij::updater::
     SingleSpinFlip<openjij::system::ClassicalIsing<openjij::graph::Dense<double>>>::
     update<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (ClIsing *system,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *random_number_engine,ClassicalUpdaterParameter *parameter)

{
  VectorXx *this;
  double dVar1;
  result_type_conflict3 rVar2;
  Scalar *pSVar3;
  size_t index;
  ulong index_00;
  double local_198;
  double local_170;
  uniform_real_distribution<double> local_168;
  PointerType local_158 [2];
  long local_148;
  XprTypeNested pMStack_140;
  long local_138;
  long lStack_130;
  Index local_128;
  Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> local_120;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a0;
  
  local_168._M_param._M_a._0_4_ = 0;
  local_168._M_param._M_a._4_4_ = 0;
  local_168._M_param._M_b._0_4_ = 0;
  local_168._M_param._M_b._4_4_ = 0x3ff00000;
  Eigen::internal::manage_multi_threading(Eigen::Action,int*)::m_maxThreads = 1;
  Eigen::initParallel();
  this = &system->dE;
  index_00 = 0;
  do {
    if (system->num_spins <= index_00) {
      return;
    }
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,index_00)
    ;
    if (*pSVar3 <= 0.0) {
LAB_0016750e:
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)system,
                          index_00);
      local_170 = *pSVar3 * 4.0;
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                (&local_120,&system->interaction,index_00);
      local_128 = local_120.
                  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                  .m_outerStride;
      local_138 = local_120.
                  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                  .m_startRow.m_value;
      lStack_130 = local_120.
                   super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                   .m_startCol.m_value;
      local_148 = local_120.
                  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                  .m_cols.m_value;
      pMStack_140 = local_120.
                    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                    .m_xpr;
      local_158[0] = local_120.
                     super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                     .m_data;
      local_158[1] = (PointerType)
                     local_120.
                     super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                     ._8_8_;
      Eigen::
      MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>const,1,-1,true>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_e8,local_158,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)system);
      Eigen::operator*(&local_a0,&local_170,(StorageBaseType *)&local_e8);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_a0);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                          index_00);
      *pSVar3 = -*pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)system,
                          index_00);
      *pSVar3 = -*pSVar3;
    }
    else {
      local_198 = -parameter->beta;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                          index_00);
      dVar1 = exp(local_198 * *pSVar3);
      rVar2 = std::uniform_real_distribution<double>::operator()(&local_168,random_number_engine);
      if (rVar2 < dVar1) goto LAB_0016750e;
    }
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)system,
                        system->num_spins);
    *pSVar3 = 1.0;
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

inline static void
  update(ClIsing &system, RandomNumberEngine &random_number_engine,
         const utility::ClassicalUpdaterParameter &parameter) {
    // set probability distribution object
    // to do Metroopolis
    auto urd = std::uniform_real_distribution<>(0, 1.0);

    Eigen::setNbThreads(1);
    Eigen::initParallel();

    // do a iteraction except for the auxiliary spin
    for (std::size_t index = 0; index < system.num_spins; ++index) {

      if (system.dE(index) <= 0 ||
          std::exp(-parameter.beta * system.dE(index)) >
              urd(random_number_engine)) {
        // update dE
        system.dE += 4 * system.spin(index) *
                     (system.interaction.row(index).transpose().cwiseProduct(
                         system.spin));

        system.dE(index) *= -1;
        system.spin(index) *= -1;
      }

      // assure that the dummy spin is not changed.
      system.spin(system.num_spins) = 1;
    }
  }